

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
* __thiscall RPCHelpMan::GetArgNames_abi_cxx11_(RPCHelpMan *this)

{
  long lVar1;
  bool bVar2;
  reference pRVar3;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  RPCArg *inner;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range3;
  RPCArg *arg;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *ret;
  const_iterator __end3;
  const_iterator __begin3;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  reference in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffffa0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __args = in_RDI;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)in_stack_ffffffffffffff68);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::size(in_stack_ffffffffffffff68);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::reserve(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::begin
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_RDI);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::end
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_RDI);
  while (bVar2 = __gnu_cxx::
                 operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                           (in_RSI,(__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                                    *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
             operator*((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                        *)in_stack_ffffffffffffff68);
    if (pRVar3->m_type == OBJ_NAMED_PARAMS) {
      std::vector<RPCArg,_std::allocator<RPCArg>_>::begin
                ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_RDI);
      std::vector<RPCArg,_std::allocator<RPCArg>_>::end
                ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_RDI);
      while (bVar2 = __gnu_cxx::
                     operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                               (in_RSI,(__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                                        *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff88 =
             __gnu_cxx::
             __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
             operator*((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                        *)in_stack_ffffffffffffff68);
        std::
        vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
        ::emplace_back<std::__cxx11::string_const&,bool>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    *)in_stack_ffffffffffffff88,__args,(bool *)in_RSI);
        __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
        ::operator++((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                      *)in_stack_ffffffffffffff68);
      }
    }
    std::
    vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
    ::emplace_back<std::__cxx11::string_const&,bool>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_ffffffffffffff88,__args,(bool *)in_RSI);
    __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
    operator++((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *)
               in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<std::string, bool>> RPCHelpMan::GetArgNames() const
{
    std::vector<std::pair<std::string, bool>> ret;
    ret.reserve(m_args.size());
    for (const auto& arg : m_args) {
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& inner : arg.m_inner) {
                ret.emplace_back(inner.m_names, /*named_only=*/true);
            }
        }
        ret.emplace_back(arg.m_names, /*named_only=*/false);
    }
    return ret;
}